

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O1

void __thiscall
cmCTestCoverageHandler::CleanCoverageLogFiles(cmCTestCoverageHandler *this,ostream *log)

{
  pointer pcVar1;
  cmCTest *this_00;
  string *psVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  ostream *poVar4;
  string *f;
  string *source;
  string logGlob;
  Glob gl;
  string local_a0;
  undefined1 local_80 [88];
  
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  pcVar1 = local_80 + 0x10;
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"BuildDirectory","");
  cmCTest::GetCTestConfiguration(&local_a0,this_00,(string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  std::__cxx11::string::append((char *)&local_a0);
  cmCTest::GetCurrentTag_abi_cxx11_((string *)local_80,(this->super_cmCTestGenericHandler).CTest);
  std::__cxx11::string::_M_append((char *)&local_a0,local_80._0_8_);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  std::__cxx11::string::append((char *)&local_a0);
  cmsys::Glob::Glob((Glob *)local_80);
  cmsys::Glob::FindFiles((Glob *)local_80,&local_a0,(GlobMessages *)0x0);
  pvVar3 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_80);
  psVar2 = (pvVar3->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (source = (pvVar3->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; source != psVar2; source = source + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(log,"Removing old coverage log: ",0x1b);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (log,(source->_M_dataplus)._M_p,source->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    cmsys::SystemTools::RemoveFile(source);
  }
  cmsys::Glob::~Glob((Glob *)local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestCoverageHandler::CleanCoverageLogFiles(std::ostream& log)
{
  std::string logGlob = this->CTest->GetCTestConfiguration("BuildDirectory");
  logGlob += "/Testing/";
  logGlob += this->CTest->GetCurrentTag();
  logGlob += "/CoverageLog*";
  cmsys::Glob gl;
  gl.FindFiles(logGlob);
  std::vector<std::string> const& files = gl.GetFiles();
  for (std::string const& f : files) {
    log << "Removing old coverage log: " << f << "\n";
    cmSystemTools::RemoveFile(f);
  }
}